

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_image.cpp
# Opt level: O3

Pixmap __thiscall
Am_Image_Array_Data::Make_Pixmap_From_Generic_Image
          (Am_Image_Array_Data *this,Am_Drawonable_Impl *draw,XColor **cols,int *n_cols)

{
  byte *pbVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  uint uVar5;
  Am_RGB_Value *pAVar6;
  Am_Generic_Image *pAVar7;
  Screen_Desc *pSVar8;
  Display *pDVar9;
  undefined8 uVar10;
  XColor *pXVar11;
  void *pvVar12;
  undefined4 *puVar13;
  Pixmap PVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  unsigned_short *puVar20;
  uchar *puVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  undefined1 auVar25 [16];
  
  pAVar6 = this->image_->color_map;
  iVar4 = (this->image_->iminfo).num_colors;
  lVar22 = (long)iVar4;
  *n_cols = iVar4;
  uVar17 = 0xffffffffffffffff;
  if (-1 < lVar22) {
    uVar17 = lVar22 << 4;
  }
  pXVar11 = (XColor *)operator_new__(uVar17);
  *cols = pXVar11;
  if (0 < lVar22) {
    puVar20 = &pAVar6->blue;
    lVar22 = 0;
    lVar23 = 0;
    do {
      pXVar11 = *cols;
      uVar5._0_2_ = ((Am_RGB_Value *)(puVar20 + -2))->red;
      uVar5._2_2_ = ((Am_RGB_Value *)(puVar20 + -2))->green;
      auVar25 = psllw(ZEXT416(uVar5),8);
      *(int *)((long)&pXVar11->red + lVar22) = auVar25._0_4_;
      *(unsigned_short *)((long)&pXVar11->blue + lVar22) = *puVar20 << 8;
      Am_Drawonable_Impl::Allocate_Closest_Color(draw,(XColor *)((long)&pXVar11->pixel + lVar22));
      lVar23 = lVar23 + 1;
      lVar22 = lVar22 + 0x10;
      puVar20 = puVar20 + 3;
    } while (lVar23 < *n_cols);
  }
  pAVar7 = this->image_;
  uVar2 = (pAVar7->iminfo).width;
  uVar17 = (ulong)uVar2;
  uVar3 = (pAVar7->iminfo).height;
  uVar24 = (ulong)uVar3;
  puVar21 = pAVar7->imdata;
  pSVar8 = draw->screen;
  uVar5 = pSVar8->depth;
  pDVar9 = pSVar8->display;
  uVar10 = *(undefined8 *)(*(long *)(pDVar9 + 0xe8) + 0x40 + (long)pSVar8->screen_number * 0x80);
  uVar15 = (uint)uVar2;
  if (uVar5 == 1) {
    uVar15 = uVar2 + 7 >> 3;
    pvVar12 = malloc((ulong)(uVar15 * uVar3));
    if (uVar24 == 0) {
      uVar24 = 0;
    }
    else {
      pXVar11 = *cols;
      uVar18 = 0;
      do {
        if (uVar17 != 0) {
          lVar22 = uVar18 * uVar15;
          uVar19 = 0;
          do {
            if (pXVar11[puVar21[uVar19]].pixel == 0) {
              pbVar1 = (byte *)((long)pvVar12 + (uVar19 >> 3 & 0x1fffffff) + lVar22);
              *pbVar1 = *pbVar1 & ~Make_Pixmap_From_Generic_Image::byte_array[(uint)uVar19 & 7];
            }
            else {
              pbVar1 = (byte *)((long)pvVar12 + (uVar19 >> 3 & 0x1fffffff) + lVar22);
              *pbVar1 = *pbVar1 | Make_Pixmap_From_Generic_Image::byte_array[(uint)uVar19 & 7];
            }
            uVar19 = uVar19 + 1;
          } while (uVar17 != uVar19);
        }
        uVar18 = uVar18 + 1;
        puVar21 = puVar21 + uVar17;
      } while (uVar18 != uVar24);
    }
  }
  else if ((int)uVar5 < 9) {
    pvVar12 = malloc(uVar24 * uVar17);
    if (uVar3 * uVar15 != 0) {
      pXVar11 = *cols;
      uVar18 = 0;
      do {
        *(char *)((long)pvVar12 + uVar18) = (char)pXVar11[puVar21[uVar18]].pixel;
        uVar18 = uVar18 + 1;
      } while (uVar3 * uVar15 != uVar18);
    }
  }
  else {
    uVar16 = uVar3 * uVar15;
    if (uVar5 < 0x11) {
      pvVar12 = malloc((ulong)(uVar3 * uVar15 * 2));
      if (uVar16 != 0) {
        pXVar11 = *cols;
        uVar18 = 0;
        do {
          *(short *)((long)pvVar12 + uVar18 * 2) = (short)pXVar11[puVar21[uVar18]].pixel;
          uVar18 = uVar18 + 1;
        } while (uVar16 != uVar18);
      }
    }
    else {
      pvVar12 = malloc((ulong)(uVar3 * uVar15 * 4));
      if (uVar16 != 0) {
        pXVar11 = *cols;
        uVar18 = 0;
        do {
          *(int *)((long)pvVar12 + uVar18 * 4) = (int)pXVar11[puVar21[uVar18]].pixel;
          uVar18 = uVar18 + 1;
        } while (uVar16 != uVar18);
      }
    }
  }
  puVar13 = (undefined4 *)XCreateImage(pDVar9,uVar10,uVar5,2,0,pvVar12,uVar17,uVar24,8,0);
  PVar14 = XCreatePixmap(draw->screen->display,draw->xlib_drawable,*puVar13,puVar13[1],puVar13[10]);
  Am_Drawonable_Impl::set_gc_using_fill(draw,&Am_No_Style,Am_DRAW_COPY,0);
  XSetClipMask(draw->screen->display,draw->screen->gc,0);
  XPutImage(draw->screen->display,PVar14,draw->screen->gc,puVar13,0,0,0,0,*puVar13,puVar13[1]);
  (*(draw->super_Am_Drawonable)._vptr_Am_Drawonable[0x1e])(draw,draw->screen->clip_region);
  (**(code **)(puVar13 + 0x18))(puVar13);
  return PVar14;
}

Assistant:

Pixmap
Am_Image_Array_Data::Make_Pixmap_From_Generic_Image(
    const Am_Drawonable_Impl *draw, XColor *&cols, int &n_cols)
{
  // Make a copy of the image data, and adjust colors in the image
  // to the ones we have in the X colormap.
  Am_RGB_Value *ctbl;
  n_cols = image_->Get_Color_Map(ctbl);
  cols = new XColor[n_cols];

  int i;
  // first, allocate all the closest colors.  Could be optimized a lot!
  for (i = 0; i < n_cols; i++) {
    cols[i].red = ctbl[i].red * 256;
    cols[i].green = ctbl[i].green * 256;
    cols[i].blue = ctbl[i].blue * 256;
    draw->Allocate_Closest_Color(cols[i]);
  }

  // Next, set the pixels in the image correctly.
  unsigned short width, height;
  image_->Get_Size(width, height);
  unsigned char *gif_image = image_->Get_Data();

  int depth = draw->screen->depth;
  Visual *visual =
      DefaultVisual(draw->screen->display, draw->screen->screen_number);

  unsigned char *x_image;

  // assume that pixels are packed into even byte boundaries
  if (depth == 1) {
    static unsigned char byte_array[] = {0x80, 0x40, 0x20, 0x10,
                                         0x08, 0x04, 0x02, 0x01};
    // X uses free() so we must use malloc.  (so says sentinel)
    int byte_width = (width + 7) / 8;
    x_image = (unsigned char *)malloc(byte_width * height);
    int i, j;
    for (i = 0; i < height; i++) {
      for (j = 0; j < width; j++) {
        if (cols[gif_image[i * width + j]].pixel)
          x_image[i * byte_width + (j / 8)] |= byte_array[j % 8];
        else
          x_image[i * byte_width + (j / 8)] &= ~byte_array[j % 8];
      }
    }
  } else if (depth <= 8) {
    // X uses free() so we must use malloc.  (so says sentinel)
    x_image = (unsigned char *)malloc(width * height);
    for (i = 0; i < (width * height); i++)
      x_image[i] = (unsigned char)(cols[gif_image[i]].pixel);
  } else if (depth <= 16) {
    // X uses free() so we must use malloc.  (so says sentinel)
    x_image = (unsigned char *)malloc(width * height * 2);
    unsigned short *x_image_16 = (unsigned short *)x_image;
    for (i = 0; i < (width * height); i++)
      x_image_16[i] = (unsigned short)(cols[gif_image[i]].pixel);
  } else {
    // X uses free() so we must use malloc.  (so says sentinel)
    x_image = (unsigned char *)malloc(width * height * 4);
    uint32_t *x_image_32 = (uint32_t*)x_image;
    for (i = 0; i < (width * height); i++)
      x_image_32[i] = (uint32_t)(cols[gif_image[i]].pixel);
  }

  XImage *image = XCreateImage(draw->screen->display, visual, depth, ZPixmap,
                               0 /* offset */, (char *)x_image, width, height,
                               8 /* bitmap_pad */,
                               0 /* (X will calculate) bytes per line */);

  Pixmap pix = XCreatePixmap(draw->screen->display, draw->xlib_drawable,
                             image->width, image->height, image->depth);
  draw->set_gc_using_fill(Am_No_Style, Am_DRAW_COPY);
  // Clear the clip region; restore it later.
  XSetClipMask(draw->screen->display, draw->screen->gc, None);
  XPutImage(draw->screen->display, pix, draw->screen->gc, image, 0, 0, 0, 0,
            image->width, image->height);
  ((Am_Drawonable_Impl *)draw)->Set_Clip(draw->screen->clip_region);

  XDestroyImage(image);

  return pix;
}